

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  uint uVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  string *psVar9;
  cmValue cVar10;
  undefined4 extraout_var;
  long *plVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  cmValue cVar12;
  long *plVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view algo;
  ostringstream cmCPackLog_msg;
  string outName;
  string tempDirectory;
  string outFile;
  string destFile;
  string topDirectory;
  ostringstream ostr;
  string line;
  ostringstream cmCPackLog_msg_10;
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  uint auStack_608 [20];
  ios_base local_5b8 [408];
  long *local_420 [2];
  long local_410 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370 [2];
  undefined1 local_360 [112];
  ios_base local_2f0 [264];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  string local_198 [3];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_628,"Create temp directory.",0x16);
  std::ios::widen((char)(ostringstream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_628);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar4 = local_360._0_8_;
  sVar7 = strlen((char *)local_360._0_8_);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3c,(char *)uVar4,sVar7);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
  std::ios_base::~ios_base(local_5b8);
  local_628._0_8_ = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_SET_DESTDIR","");
  bVar5 = IsOn(this,(string *)local_628);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
  }
  if (bVar5) {
    iVar6 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar6 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_628,"CPACK_SET_DESTDIR is set to ON but the \'",0x28);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_628,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\' generator does NOT support it.",0x20);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_360._0_8_;
      sVar7 = strlen((char *)local_360._0_8_);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x44,(char *)uVar4,sVar7);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
      return 0;
    }
    iVar6 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar6 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_628,"CPACK_SET_DESTDIR is set to ON but it is ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_628,"usually a bad idea to do that with \'",0x24);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_628,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\' generator. Use at your own risk.",0x22);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_360._0_8_;
      sVar7 = strlen((char *)local_360._0_8_);
      cmCPackLog::Log(pcVar2,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4b,(char *)uVar4,sVar7);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
    }
  }
  local_360._0_8_ = local_360 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CPACK_PACKAGE_DIRECTORY","");
  psVar9 = (string *)GetOption(this,(string *)local_360);
  if (psVar9 == (string *)0x0) {
    psVar9 = &cmValue::Empty_abi_cxx11_;
  }
  local_628._8_8_ = (psVar9->_M_dataplus)._M_p;
  local_628._0_8_ = psVar9->_M_string_length;
  local_618._0_8_ = 0x11;
  local_618._8_8_ = "/_CPack_Packages/";
  views._M_len = 2;
  views._M_array = (iterator)local_628;
  cmCatViews_abi_cxx11_(&local_3e0,views);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  local_628._0_8_ = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_TOPLEVEL_TAG","");
  cVar10 = GetOption(this,(string *)local_628);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
  }
  if (cVar10.Value != (string *)0x0) {
    std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)((cVar10.Value)->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3e0);
  }
  local_628._0_8_ = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_GENERATOR","");
  psVar9 = (string *)GetOption(this,(string *)local_628);
  if (psVar9 == (string *)0x0) {
    psVar9 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)(psVar9->_M_dataplus)._M_p);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
  }
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_3e0._M_dataplus._M_p,
             local_3e0._M_dataplus._M_p + local_3e0._M_string_length);
  local_628._0_8_ = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_PACKAGE_FILE_NAME","");
  cVar10 = GetOption(this,(string *)local_628);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
  }
  if (cVar10.Value == (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_628,"CPACK_PACKAGE_FILE_NAME not specified",0x25);
    std::ios::widen((char)(ostream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18));
    std::ostream::put((char)local_628);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_360._0_8_;
    sVar7 = strlen((char *)local_360._0_8_);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x5b,(char *)uVar4,sVar7);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    std::ios_base::~ios_base(local_5b8);
    iVar6 = 0;
    goto LAB_001616ee;
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  pcVar3 = ((cVar10.Value)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar3,pcVar3 + (cVar10.Value)->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,"/",
                 &local_400);
  std::__cxx11::string::_M_append((char *)&local_3e0,local_628._0_8_);
  if ((undefined1 *)local_628._0_8_ != local_618) {
    operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
  }
  iVar6 = (*this->_vptr_cmCPackGenerator[4])(this);
  if (CONCAT44(extraout_var,iVar6) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_628,"No output extension specified",0x1d);
    std::ios::widen((char)(ostream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18));
    std::ostream::put((char)local_628);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_360._0_8_;
    sVar7 = strlen((char *)local_360._0_8_);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x62,(char *)uVar4,sVar7);
LAB_00160938:
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    std::ios_base::~ios_base(local_5b8);
    iVar6 = 0;
  }
  else {
    (*this->_vptr_cmCPackGenerator[4])(this);
    std::__cxx11::string::append((char *)&local_400);
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_PACKAGE_DIRECTORY","");
    cVar10 = GetOption(this,(string *)local_628);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    if (cVar10.Value == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_628,"CPACK_PACKAGE_DIRECTORY not specified",0x25);
      std::ios::widen((char)(ostream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18));
      std::ostream::put((char)local_628);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_360._0_8_;
      sVar7 = strlen((char *)local_360._0_8_);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x69,(char *)uVar4,sVar7);
      goto LAB_00160938;
    }
    local_3a0[0] = local_390;
    pcVar3 = ((cVar10.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a0,pcVar3,pcVar3 + (cVar10.Value)->_M_string_length);
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_OUTPUT_FILE_PREFIX","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,(string *)local_3a0);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                   "/",&local_400);
    std::__cxx11::string::_M_append((char *)local_3a0,local_628._0_8_);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_628,local_380,local_378 + (long)local_380);
    std::__cxx11::string::append(local_628);
    plVar11 = (long *)std::__cxx11::string::_M_append(local_628,(ulong)local_400._M_dataplus._M_p);
    local_3c0 = &local_3b0;
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_3b0 = *plVar13;
      lStack_3a8 = plVar11[3];
    }
    else {
      local_3b0 = *plVar13;
      local_3c0 = (long *)*plVar11;
    }
    local_3b8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_TOPLEVEL_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,(string *)&local_380);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_TEMPORARY_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,&local_3e0);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_OUTPUT_FILE_NAME","")
    ;
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,&local_400);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"CPACK_OUTPUT_FILE_PATH","")
    ;
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,(string *)local_3a0);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,(string *)&local_3c0);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_INSTALL_DIRECTORY","");
    iVar6 = (*this->_vptr_cmCPackGenerator[10])(this);
    StoreOptionIfNotSet<char_const*>
              (this,(string *)local_628,(char *)CONCAT44(extraout_var_00,iVar6));
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_NATIVE_INSTALL_DIRECTORY","");
    iVar6 = (*this->_vptr_cmCPackGenerator[10])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(char *)CONCAT44(extraout_var_01,iVar6),
               (allocator<char> *)&local_1c8);
    cmsys::SystemTools::ConvertToOutputPath((string *)local_360,(string *)local_1a8);
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,(string *)local_360);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if ((string *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
    }
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_628,&local_3e0);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_628,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE",0x28);
    std::ios::widen((char)(ostream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18));
    std::ostream::put((char)local_628);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_360._0_8_;
    sVar7 = strlen((char *)local_360._0_8_);
    cmCPackLog::Log(pcVar2,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x7d,(char *)uVar4,sVar7);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    std::ios_base::~ios_base(local_5b8);
    local_628._0_8_ = local_618;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_628,"CPACK_PACKAGE_DESCRIPTION_FILE","");
    cVar10 = GetOption(this,(string *)local_628);
    if ((undefined1 *)local_628._0_8_ != local_618) {
      operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
    }
    if (cVar10.Value == (string *)0x0) {
      bVar5 = false;
    }
    else {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"CPACK_PACKAGE_DESCRIPTION","");
      cVar12 = GetOption(this,&local_1c8);
      bVar5 = cVar12.Value == (string *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"Look for: ",10);
      poVar8 = operator<<((ostream *)local_628,cVar10);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_360._0_8_;
      sVar7 = strlen((char *)local_360._0_8_);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x81,(char *)uVar4,sVar7);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base(local_5b8);
      psVar9 = cVar10.Value;
      if (cVar10.Value == (string *)0x0) {
        psVar9 = &cmValue::Empty_abi_cxx11_;
      }
      bVar5 = cmsys::SystemTools::FileExists(psVar9);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_628,"Cannot find description file name: [",0x24);
        poVar8 = operator<<((ostream *)local_628,cVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_360._0_8_;
        sVar7 = strlen((char *)local_360._0_8_);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x85,(char *)uVar4,sVar7);
        goto LAB_0016163a;
      }
      std::ifstream::ifstream(local_628,(psVar9->_M_dataplus)._M_p,_S_in);
      uVar1 = *(uint *)((long)auStack_608 + *(long *)(local_628._0_8_ + -0x18));
      if ((uVar1 & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Read description file: ",0x17);
        poVar8 = operator<<((ostream *)local_1a8,cVar10);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        plVar11 = local_420[0];
        sVar7 = strlen((char *)local_420[0]);
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x93,(char *)plVar11,sVar7);
        if (local_420[0] != local_410) {
          operator_delete(local_420[0],local_410[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((*(byte *)((long)auStack_608 + *(long *)(local_628._0_8_ + -0x18)) & 5) == 0) {
          do {
            bVar5 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_628,&local_1e8,(bool *)0x0,0xffffffffffffffff);
            if (!bVar5) break;
            cmXMLSafe::cmXMLSafe((cmXMLSafe *)local_1a8,&local_1e8);
            poVar8 = operator<<((ostream *)local_360,(cmXMLSafe *)local_1a8);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          } while ((*(byte *)((long)auStack_608 + *(long *)(local_628._0_8_ + -0x18)) & 5) == 0);
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_PACKAGE_DESCRIPTION","");
        std::__cxx11::stringbuf::str();
        StoreOption<cmValue>(this,(string *)local_1a8,(string *)local_420);
        if (local_420[0] != local_410) {
          operator_delete(local_420[0],local_410[0] + 1);
        }
        if ((string *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE","");
        cVar12 = GetOption(this,(string *)local_1a8);
        if ((string *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
        }
        if ((cVar12.Value != (string *)0x0) &&
           (local_1a8._0_8_ = cVar12, iVar6 = cmValue::Compare((cmValue *)local_1a8,cVar10),
           iVar6 == 0)) {
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE","");
          StoreOption<char_const*>(this,(string *)local_1a8,"ON");
          if ((string *)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                   local_1e8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
        std::ios_base::~ios_base(local_2f0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_360,"Cannot open description file name: ",0x23);
        poVar8 = operator<<((ostream *)local_360,cVar10);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_1a8._0_8_;
        sVar7 = strlen((char *)local_1a8._0_8_);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x8c,(char *)uVar4,sVar7);
        if ((string *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
        std::ios_base::~ios_base(local_2f0);
      }
      std::ifstream::~ifstream(local_628);
      iVar6 = 0;
      if ((uVar1 & 5) == 0) goto LAB_0016141c;
    }
    else {
LAB_0016141c:
      local_628._0_8_ = local_618;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_628,"CPACK_PACKAGE_DESCRIPTION","");
      cVar10 = GetOption(this,(string *)local_628);
      if ((undefined1 *)local_628._0_8_ != local_618) {
        operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
      }
      if (cVar10.Value == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_628,
                   "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                   ,0x6e);
        std::ios::widen((char)(ostream *)local_628 + (char)*(undefined8 *)(local_628._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_628);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_360._0_8_;
        sVar7 = strlen((char *)local_360._0_8_);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa3,(char *)uVar4,sVar7);
LAB_0016163a:
        if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
          operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
        std::ios_base::~ios_base(local_5b8);
        iVar6 = 0;
      }
      else {
        local_628._0_8_ = local_618;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_628,"CPACK_PACKAGE_CHECKSUM","");
        cVar10 = GetOption(this,(string *)local_628);
        if ((undefined1 *)local_628._0_8_ != local_618) {
          operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
        }
        if (cVar10.Value != (string *)0x0) {
          algo._M_str = (char *)(cVar10.Value)->_M_string_length;
          algo._M_len = (size_t)local_628;
          cmCryptoHash::New(algo);
          uVar4 = local_628._0_8_;
          std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                    ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_628);
          if ((pointer)uVar4 == (pointer)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_628,"Cannot recognize algorithm: ",0x1c);
            poVar8 = operator<<((ostream *)local_628,cVar10);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            uVar4 = local_360._0_8_;
            sVar7 = strlen((char *)local_360._0_8_);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xab,(char *)uVar4,sVar7);
            goto LAB_0016163a;
          }
        }
        local_628._0_8_ = local_618;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_628,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
        StoreOptionIfNotSet<char_const*>(this,(string *)local_628,"1");
        if ((undefined1 *)local_628._0_8_ != local_618) {
          operator_delete((void *)local_628._0_8_,local_618._0_8_ + 1);
        }
        iVar6 = 1;
      }
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    if (local_3a0[0] != local_390) {
      operator_delete(local_3a0[0],local_390[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
LAB_001616ee:
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (this->IsOn("CPACK_SET_DESTDIR")) {
    if (SETDESTDIR_UNSUPPORTED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_SET_DESTDIR is set to ON but the '"
                      << this->Name << "' generator does NOT support it."
                      << std::endl);
      return 0;
    }
    if (SETDESTDIR_SHOULD_NOT_BE_USED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_WARNING,
                    "CPACK_SET_DESTDIR is set to ON but it is "
                      << "usually a bad idea to do that with '" << this->Name
                      << "' generator. Use at your own risk." << std::endl);
    }
  }

  std::string tempDirectory =
    cmStrCat(this->GetOption("CPACK_PACKAGE_DIRECTORY"), "/_CPack_Packages/");
  cmValue toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if (toplevelTag) {
    tempDirectory += *toplevelTag;
    tempDirectory += "/";
  }
  tempDirectory += *this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  cmValue pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if (!pfname) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
  }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if (!this->GetOutputExtension()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
  }
  outName += this->GetOutputExtension();
  cmValue pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if (!pdir) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
  }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile);
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME", outFile);
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet(
    "CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()));
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY", tempDirectory);

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  cmValue descFileName = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (descFileName && !this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if (!cmSystemTools::FileExists(descFileName)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                      << descFileName << "]" << std::endl);
      return 0;
    }
    cmsys::ifstream ifs(descFileName->c_str());
    if (!ifs) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot open description file name: " << descFileName
                                                          << std::endl);
      return 0;
    }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Read description file: " << descFileName << std::endl);
    while (ifs && cmSystemTools::GetLineFromStream(ifs, line)) {
      ostr << cmXMLSafe(line) << std::endl;
    }
    this->SetOption("CPACK_PACKAGE_DESCRIPTION", ostr.str());
    cmValue defFileName =
      this->GetOption("CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE");
    if (defFileName && (defFileName == descFileName)) {
      this->SetOption("CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE", "ON");
    }
  }
  if (!this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
        << std::endl);
    return 0;
  }
  cmValue algoSignature = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  if (algoSignature) {
    if (!cmCryptoHash::New(*algoSignature)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot recognize algorithm: " << algoSignature
                                                   << std::endl);
      return 0;
    }
  }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}